

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

bool __thiscall
FOptionMenuNumberField::MenuEvent(FOptionMenuNumberField *this,int mkey,bool fromcontroller)

{
  FBaseCVar *pFVar1;
  UCVarValue value;
  bool bVar2;
  float fVar3;
  UCVarValue vval;
  FSoundID local_1c;
  
  pFVar1 = (this->super_FOptionMenuFieldBase).mCVar;
  if (pFVar1 != (FBaseCVar *)0x0) {
    fVar3 = (float)(*pFVar1->_vptr_FBaseCVar[4])(pFVar1,2);
    if ((mkey == 6) || (mkey == 3)) {
      fVar3 = fVar3 + this->mStep;
      if (this->mMaximum <= fVar3 && fVar3 != this->mMaximum) {
        fVar3 = this->mMinimum;
      }
    }
    else {
      if (mkey != 2) {
        bVar2 = FListMenuItem::MenuEvent((FListMenuItem *)this,mkey,fromcontroller);
        return bVar2;
      }
      fVar3 = fVar3 - this->mStep;
      if (fVar3 < this->mMinimum) {
        fVar3 = this->mMaximum;
      }
    }
    value._4_4_ = vval._4_4_;
    value.Float = fVar3;
    FBaseCVar::SetGenericRep((this->super_FOptionMenuFieldBase).mCVar,value,CVAR_Float);
    local_1c.ID = S_FindSound("menu/change");
    S_Sound(0x22,&local_1c,snd_menuvolume.Value,0.0);
  }
  return true;
}

Assistant:

bool MenuEvent ( int mkey, bool fromcontroller )
	{
		if ( mCVar )
		{
			float value = mCVar->GetGenericRep( CVAR_Float ).Float;

			if ( mkey == MKEY_Left )
			{
				value -= mStep;

				if ( value < mMinimum )
					value = mMaximum;
			}
			else if ( mkey == MKEY_Right || mkey == MKEY_Enter )
			{
				value += mStep;

				if ( value > mMaximum )
					value = mMinimum;
			}
			else
				return FOptionMenuItem::MenuEvent( mkey, fromcontroller );

			UCVarValue vval;
			vval.Float = value;
			mCVar->SetGenericRep( vval, CVAR_Float );
			S_Sound( CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE );
		}

		return true;
	}